

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

jsgf_rule_t * jsgf_get_rule(jsgf_t *grammar,char *name)

{
  int32 iVar1;
  char *key;
  char *fullname;
  void *val;
  char *name_local;
  jsgf_t *grammar_local;
  
  val = name;
  name_local = (char *)grammar;
  key = string_join("<",name,">",0);
  iVar1 = hash_table_lookup(*(hash_table_t **)(name_local + 0x20),key,&fullname);
  if (iVar1 < 0) {
    ckd_free(key);
    grammar_local = (jsgf_t *)0x0;
  }
  else {
    ckd_free(key);
    grammar_local = (jsgf_t *)fullname;
  }
  return (jsgf_rule_t *)grammar_local;
}

Assistant:

jsgf_rule_t *
jsgf_get_rule(jsgf_t * grammar, char const *name)
{
    void *val;
    char *fullname;

    fullname = string_join("<", name, ">", NULL);
    if (hash_table_lookup(grammar->rules, fullname, &val) < 0) {
        ckd_free(fullname);
        return NULL;
    }
    ckd_free(fullname);
    return (jsgf_rule_t *) val;
}